

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_int32 *
drwav_open_file_and_read_s32
          (char *filename,uint *channels,uint *sampleRate,drwav_uint64 *totalSampleCount)

{
  drwav_bool32 dVar1;
  drwav_int32 *pdVar2;
  drwav wav;
  drwav local_1c0;
  
  if (sampleRate != (uint *)0x0) {
    *sampleRate = 0;
  }
  if (channels != (uint *)0x0) {
    *channels = 0;
  }
  if (totalSampleCount != (drwav_uint64 *)0x0) {
    *totalSampleCount = 0;
  }
  pdVar2 = (drwav_int32 *)0x0;
  dVar1 = drwav_init_file_ex(&local_1c0,filename,(drwav_chunk_proc)0x0,(void *)0x0,0);
  if (dVar1 != 0) {
    pdVar2 = drwav__read_and_close_s32(&local_1c0,channels,sampleRate,totalSampleCount);
  }
  return pdVar2;
}

Assistant:

drwav_int32* drwav_open_file_and_read_s32(const char* filename, unsigned int* channels, unsigned int* sampleRate, drwav_uint64* totalSampleCount)
{
    if (sampleRate) *sampleRate = 0;
    if (channels) *channels = 0;
    if (totalSampleCount) *totalSampleCount = 0;

    drwav wav;
    if (!drwav_init_file(&wav, filename)) {
        return NULL;
    }

    return drwav__read_and_close_s32(&wav, channels, sampleRate, totalSampleCount);
}